

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::ConsoleReporter::printSummaryRow
          (ConsoleReporter *this,string *label,
          vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> *cols,size_t row)

{
  long lVar1;
  bool bVar2;
  ostream *poVar3;
  pointer pSVar4;
  long in_FS_OFFSET;
  Colour local_a9;
  string *local_a8;
  pointer local_a0;
  string value;
  SummaryColumn col;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar4 = (cols->super__Vector_base<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>).
           _M_impl.super__Vector_impl_data._M_start;
  local_a0 = (cols->super__Vector_base<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>)
             ._M_impl.super__Vector_impl_data._M_finish;
  local_a8 = label;
  do {
    if (pSVar4 == local_a0) {
      std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,'\n');
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      __stack_chk_fail();
    }
    SummaryColumn::SummaryColumn(&col,pSVar4);
    std::__cxx11::string::string
              ((string *)&value,
               (string *)
               (col.rows.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + row));
    if (col.label._M_string_length == 0) {
      poVar3 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                               (string *)local_a8);
      std::operator<<(poVar3,": ");
      bVar2 = std::operator!=(&value,"0");
      poVar3 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
      if (!bVar2) {
        local_a9.m_moved = false;
        Colour::use(BrightYellow);
        std::operator<<(poVar3,"- none -");
        goto LAB_0018688e;
      }
      std::operator<<(poVar3,(string *)&value);
    }
    else {
      bVar2 = std::operator!=(&value,"0");
      if (bVar2) {
        poVar3 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
        local_a9.m_moved = false;
        Colour::use(FileName);
        std::operator<<(poVar3," | ");
        Colour::~Colour(&local_a9);
        poVar3 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
        local_a9.m_moved = false;
        Colour::use(col.colour);
        poVar3 = std::operator<<(poVar3,(string *)&value);
        poVar3 = std::operator<<(poVar3,' ');
        std::operator<<(poVar3,(string *)&col);
LAB_0018688e:
        Colour::~Colour(&local_a9);
      }
    }
    std::__cxx11::string::~string((string *)&value);
    SummaryColumn::~SummaryColumn(&col);
    pSVar4 = pSVar4 + 1;
  } while( true );
}

Assistant:

void ConsoleReporter::printSummaryRow(std::string const& label, std::vector<SummaryColumn> const& cols, std::size_t row) {
    for (auto col : cols) {
        std::string value = col.rows[row];
        if (col.label.empty()) {
            stream << label << ": ";
            if (value != "0")
                stream << value;
            else
                stream << Colour(Colour::Warning) << "- none -";
        } else if (value != "0") {
            stream << Colour(Colour::LightGrey) << " | ";
            stream << Colour(col.colour)
                << value << ' ' << col.label;
        }
    }
    stream << '\n';
}